

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageinfo.cxx
# Opt level: O1

void __thiscall
vigra::ImageImportInfo::ImageImportInfo(ImageImportInfo *this,char *filename,uint imageIndex)

{
  pointer pvVar1;
  allocator local_29;
  
  std::__cxx11::string::string((string *)this,filename,&local_29);
  (this->m_filetype)._M_dataplus._M_p = (pointer)&(this->m_filetype).field_2;
  (this->m_filetype)._M_string_length = 0;
  (this->m_filetype).field_2._M_local_buf[0] = '\0';
  (this->m_pixeltype)._M_dataplus._M_p = (pointer)&(this->m_pixeltype).field_2;
  (this->m_pixeltype)._M_string_length = 0;
  (this->m_pixeltype).field_2._M_local_buf[0] = '\0';
  this->m_image_index = imageIndex;
  (this->m_pos).x = 0;
  (this->m_pos).y = 0;
  (this->m_canvas_size).super_Diff2D = (Diff2D)0x0;
  (this->m_icc_profile).super_ArrayVectorView<unsigned_char>.size_ = 0;
  (this->m_icc_profile).super_ArrayVectorView<unsigned_char>.data_ = (pointer)0x0;
  (this->m_icc_profile).capacity_ = 2;
  pvVar1 = (pointer)operator_new(2);
  (this->m_icc_profile).super_ArrayVectorView<unsigned_char>.data_ = pvVar1;
  readHeader_(this);
  return;
}

Assistant:

ImageImportInfo::ImageImportInfo( const char * filename, unsigned int imageIndex )
    : m_filename(filename), m_image_index(imageIndex)
{
    readHeader_();
}